

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

int Tas_ManPropagate(Tas_Man_t *p,int Level)

{
  int iVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int k;
  int i;
  Gia_Obj_t *pVar;
  int hClause;
  int Level_local;
  Tas_Man_t *p_local;
  
  do {
    local_2c = (p->pProp).iHead;
    while( true ) {
      bVar2 = false;
      if (local_2c < (p->pProp).iTail) {
        _k = (p->pProp).pData[local_2c];
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Tas_ManPropagateOne(p,_k,Level);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_2c = local_2c + 1;
    }
    (p->pProp).iHead = (p->pProp).iTail;
    local_30 = (p->pJust).iHead;
    local_2c = (p->pJust).iHead;
    while( true ) {
      bVar2 = false;
      if (local_2c < (p->pJust).iTail) {
        _k = (p->pJust).pData[local_2c];
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Tas_VarIsJust(_k);
      if (iVar1 == 0) {
        iVar1 = Tas_ManPropagateTwo(p,_k,Level);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else {
        (p->pJust).pData[local_30] = _k;
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
    if (local_30 == (p->pJust).iTail) {
      return 0;
    }
    (p->pJust).iTail = local_30;
  } while( true );
}

Assistant:

int Tas_ManPropagate( Tas_Man_t * p, int Level )
{
    int hClause;
    Gia_Obj_t * pVar;
    int i, k;//, nIter = 0;
    while ( 1 )
    {
//        nIter++;
        Tas_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( (hClause = Tas_ManPropagateOne( p, pVar, Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Tas_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Tas_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( (hClause = Tas_ManPropagateTwo( p, pVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
//    printf( "%d ", nIter );
    return 0;
}